

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O2

bool wallet::IsBDBFile(path *path)

{
  string_view source_file;
  undefined1 auVar1 [16];
  bool bVar2;
  char cVar3;
  ulong uVar4;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view logging_function;
  error_code ec;
  ifstream file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [31];
  string local_e0;
  string local_c0 [128];
  uint32_t data;
  char *pcStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::filesystem::exists(&path->super_path);
  if (bVar2) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    uVar4 = std::filesystem::file_size(&path->super_path,&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))(local_c0);
      std::filesystem::__cxx11::path::string(&local_e0,&path->super_path);
      pLVar5 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar5);
      if (bVar2) {
        _file = (pointer)local_2d8;
        local_2d8[0]._M_local_buf[0] = '\0';
        tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                  ((string *)&data,(tinyformat *)"%s: %s %s\n","IsBDBFile",(char (*) [10])local_c0,
                   &local_e0,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
        std::__cxx11::string::~string((string *)&data);
        pLVar5 = LogInstance();
        _data = (pointer)0x56;
        pcStack_38 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/db.cpp";
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file._M_len = 0x56;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = _file;
        logging_function._M_str = "IsBDBFile";
        logging_function._M_len = 9;
        BCLog::Logger::LogPrintStr
                  (pLVar5,(string_view)(auVar1 << 0x40),logging_function,source_file,0x67,ALL,Info);
        std::__cxx11::string::~string((string *)&file);
      }
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string(local_c0);
    }
    if (0xfff < uVar4) {
      std::ifstream::ifstream<fs::path,fs::path>((ifstream *)&file,path,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        bVar2 = false;
      }
      else {
        std::istream::seekg((long)&file,0xc);
        _data = _data & 0xffffffff00000000;
        std::istream::read((char *)&file,(long)&data);
        bVar2 = data == 0x62310500 || data == 0x53162;
      }
      std::ifstream::~ifstream(&file);
      goto LAB_004b21d6;
    }
  }
  bVar2 = false;
LAB_004b21d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBDBFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A Berkeley DB Btree file has at least 4K.
    // This check also prevents opening lock files.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 4096) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    file.seekg(12, std::ios::beg); // Magic bytes start at offset 12
    uint32_t data = 0;
    file.read((char*) &data, sizeof(data)); // Read 4 bytes of file to compare against magic

    // Berkeley DB Btree magic bytes, from:
    //  https://github.com/file/file/blob/5824af38469ec1ca9ac3ffd251e7afe9dc11e227/magic/Magdir/database#L74-L75
    //  - big endian systems - 00 05 31 62
    //  - little endian systems - 62 31 05 00
    return data == 0x00053162 || data == 0x62310500;
}